

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O0

bool sptk::ReadStream(Matrix *matrix_to_read,istream *input_stream)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  long lVar5;
  Matrix *in_RSI;
  Matrix *in_RDI;
  int num_read_bytes;
  int type_byte;
  byte local_35;
  
  if ((((in_RDI != (Matrix *)0x0) && (iVar1 = Matrix::GetNumRow(in_RDI), iVar1 != 0)) &&
      (iVar1 = Matrix::GetNumColumn(in_RDI), iVar1 != 0)) &&
     ((in_RSI != (Matrix *)0x0 && (uVar3 = std::ios::eof(), (uVar3 & 1) == 0)))) {
    iVar1 = Matrix::GetNumRow(in_RDI);
    iVar1 = iVar1 << 3;
    iVar2 = Matrix::GetNumColumn(in_RDI);
    pdVar4 = Matrix::operator[](in_RSI,iVar1);
    std::istream::read((char *)in_RSI,(long)pdVar4);
    lVar5 = std::istream::gcount();
    if (iVar1 * iVar2 == lVar5) {
      local_35 = std::ios::fail();
      local_35 = local_35 ^ 0xff;
    }
    else {
      local_35 = 0;
    }
    return (bool)(local_35 & 1);
  }
  return false;
}

Assistant:

bool ReadStream(sptk::Matrix* matrix_to_read, std::istream* input_stream) {
  if (NULL == matrix_to_read || 0 == matrix_to_read->GetNumRow() ||
      0 == matrix_to_read->GetNumColumn() || NULL == input_stream ||
      input_stream->eof()) {
    return false;
  }

  const int type_byte(sizeof((*matrix_to_read)[0][0]));

  const int num_read_bytes(type_byte * matrix_to_read->GetNumRow() *
                           matrix_to_read->GetNumColumn());
  input_stream->read(reinterpret_cast<char*>(&((*matrix_to_read)[0][0])),
                     num_read_bytes);

  return (num_read_bytes == input_stream->gcount()) ? !input_stream->fail()
                                                    : false;
}